

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatTypeSCP.cpp
# Opt level: O1

int __thiscall
FormatTypeSCP::SaveDisk
          (FormatTypeSCP *this,char *file_path,IDisk *disk,ILoadingProgress *loading_progress)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  byte bVar5;
  int iVar6;
  uint uVar7;
  undefined2 *__ptr;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  ushort uVar12;
  int iVar13;
  ulong uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  ulong uVar18;
  uint uVar19;
  long lVar20;
  int iVar21;
  FILE *file;
  uchar buffer [680];
  FILE *local_308;
  int local_2fc;
  undefined8 local_2f8;
  Side *local_2f0;
  ulong local_2e8;
  IDisk *local_2e0;
  byte local_2d8 [8];
  undefined2 local_2d0;
  undefined1 local_2ce;
  int local_2cc;
  byte abStack_2c8 [664];
  
  iVar13 = 0;
  memset(local_2d8,0,0x2a8);
  uVar15 = disk->side_[0].nb_tracks;
  uVar7 = disk->side_[1].nb_tracks;
  uVar2 = uVar15 + uVar7;
  if (uVar7 == 0) {
    uVar2 = uVar15 * 2;
  }
  iVar6 = IDisk::SmartOpen(disk,(FILE **)&local_308,file_path,".SCP");
  if (iVar6 == 0) {
    local_2d8[0] = 0x53;
    local_2d8[1] = 0x43;
    local_2d8[2] = 0x50;
    local_2d8[3] = 0x11;
    local_2d8[4] = 0;
    local_2d8[5] = 1;
    local_2d8[6] = 0;
    local_2d8[7] = (char)uVar2 + -1;
    local_2d0 = 0;
    local_2ce = 2;
    fwrite(local_2d8,0x2a8,1,local_308);
    if (0 < (int)uVar2) {
      local_2f0 = disk->side_;
      local_2fc = 0x2a8;
      uVar15 = 0;
      iVar13 = 0;
      local_2f8 = 0;
      local_2e8 = (ulong)uVar2;
      local_2e0 = disk;
      do {
        if ((disk->side_[1].nb_tracks == 0) || (disk->nb_sides_ == '\x01')) {
          uVar7 = 0;
        }
        else {
          uVar7 = uVar15 & 1;
        }
        lVar10 = *(long *)((long)&local_2f0->tracks + (ulong)(uVar7 << 4));
        lVar20 = (ulong)(uVar15 >> 1) * 0x20;
        uVar7 = *(uint *)(lVar10 + 0x18 + lVar20);
        uVar9 = 200000000 / (long)(int)(uVar7 * 0x19);
        uVar8 = uVar9 & 0xffffffff;
        *(int *)(abStack_2c8 + (ulong)uVar15 * 4) = local_2fc;
        __ptr = (undefined2 *)operator_new__((long)(int)uVar7 * 2 + 0x40);
        disk = local_2e0;
        uVar4 = local_2e8;
        *__ptr = 0x5254;
        *(undefined1 *)(__ptr + 1) = 0x4b;
        *(char *)((long)__ptr + 3) = (char)local_2f8;
        *(undefined4 *)(__ptr + 2) = 8000000;
        *(undefined4 *)(__ptr + 6) = 0x10;
        uVar11 = 1;
        if (1 < uVar7) {
          lVar1 = *(long *)(lVar10 + 0x10 + lVar20);
          uVar11 = 1;
          do {
            if ((*(char *)(lVar1 + -1 + uVar11) == '\x01') || (*(char *)(lVar1 + uVar11) == '\0'))
            goto LAB_0016142d;
            uVar11 = uVar11 + 1;
          } while (uVar7 != (uint)uVar11);
          uVar11 = (ulong)uVar7;
        }
LAB_0016142d:
        if ((int)uVar7 < 1) {
          iVar6 = 0;
          uVar14 = 0x10;
        }
        else {
          uVar15 = 0;
          uVar14 = 0x10;
          iVar21 = (int)uVar9;
          iVar6 = 0;
          do {
            uVar2 = uVar15 + 1;
            if ((int)(uVar15 + 1) < (int)uVar7) {
              uVar2 = uVar7;
            }
            uVar18 = uVar9 & 0xffffffff;
            do {
              uVar17 = (uint)uVar18;
              uVar19 = (uint)uVar8;
              uVar16 = uVar15;
              if ((*(byte *)(*(long *)(lVar10 + lVar20 + 0x10) +
                            (ulong)((int)uVar11 + uVar15) % (ulong)uVar7) & 1) != 0) break;
              uVar17 = uVar17 + iVar21;
              uVar18 = (ulong)uVar17;
              uVar19 = uVar19 + iVar21;
              uVar8 = (ulong)uVar19;
              uVar15 = uVar15 + 1;
              uVar16 = uVar2;
            } while (uVar2 != uVar15);
            uVar15 = uVar16 + 1;
            iVar3 = (int)(long)(((double)(int)uVar16 + 1.0) *
                               (200000000.0 / ((double)(int)uVar7 * 25.0)));
            uVar8 = (ulong)(uint)(iVar21 + iVar3);
            uVar12 = (ushort)((iVar3 - uVar19) + uVar17);
            *(ushort *)((long)__ptr + uVar14) = uVar12 << 8 | uVar12 >> 8;
            uVar14 = uVar14 + 2;
            iVar6 = iVar6 + 1;
          } while ((int)uVar15 < (int)uVar7);
        }
        *(int *)(__ptr + 4) = iVar6;
        uVar9 = 0;
        do {
          iVar13 = iVar13 + (uint)*(byte *)((long)__ptr + uVar9);
          uVar9 = uVar9 + 1;
        } while ((uVar14 & 0xffffffff) != uVar9);
        local_2fc = local_2fc + (int)uVar14;
        fwrite(__ptr,uVar14 & 0xffffffff,1,local_308);
        operator_delete__(__ptr);
        bVar5 = (char)local_2f8 + 1;
        local_2f8 = CONCAT71((int7)((ulong)local_2f8 >> 8),bVar5);
        uVar15 = (uint)bVar5;
      } while ((int)uVar15 < (int)uVar4);
    }
    lVar10 = 0x10;
    do {
      iVar13 = iVar13 + (uint)local_2d8[lVar10];
      lVar10 = lVar10 + 1;
    } while (lVar10 != 0x2a8);
    local_2cc = iVar13;
    fseek(local_308,0,0);
    fwrite(local_2d8,0x2a8,1,local_308);
    disk->disk_modified_ = false;
    fclose(local_308);
  }
  return 0;
}

Assistant:

int FormatTypeSCP::SaveDisk(const char* file_path, IDisk* disk, ILoadingProgress* loading_progress) const
{
   unsigned int checksum = 0;
   int ret = 0;
   int i;
   FILE* file;
   int offset = 0;
   unsigned char buffer[0x2A8] = {0};

   unsigned char* pTrackBuffer; // = new unsigned char[m_Disk[0].NbTracks + m_Disk[1].NbTracks];
   //int*pTrackBufferSize = new int [m_Disk[0].NbTracks + m_Disk[1].NbTracks];

   int nbSideToRecord = (disk->side_[1].nb_tracks == 0)
                           ? disk->side_[0].nb_tracks * 2
                           : disk->side_[0].nb_tracks + disk->side_[1].nb_tracks;

   int res = disk->SmartOpen(&file, file_path, ".SCP");

   if (res == 0)
   {
      // First part
      memcpy(&buffer[offset], "SCP", 3);
      offset += 3;
      buffer[offset++] = 0x11;
      buffer[offset++] = 0x00;
      buffer[offset++] = 0x01; // One revolution only
      buffer[offset++] = 0x00; // Start track
      buffer[offset++] = nbSideToRecord - 1; // End track
      buffer[offset++] = 0x00; // Flags bits
      buffer[offset++] = 0x00; // Bit cell encoding
      buffer[offset++] = 0x02; // Two side...

      offset += 1; // Reserved

      // checksum is added later
      offset = 0x2A8;
      // Tracks
      // CHEAT : If no 2nd side is recorded, just record twice the first one....


      checksum = 0;

      // Write begining...
      fwrite(buffer, 0x2A8, 1, file);

      for (unsigned char track = 0; track < nbSideToRecord; track++)
      {
         int side = (disk->side_[1].nb_tracks == 0 || disk->nb_sides_ == 1 ) ? 0 : track % 2;

         int dskTrack = /*(m_Disk[1].NbTracks==0)?track:*/track >> 1;

         int tracklength = disk->side_[side].tracks[dskTrack]/*.Revolution[0]*/.size;

         // Taille de la clock :
         // Pour un bitcell a 2us :
         // int clock = 2000 / 25; // 2 us
         // Pour un bitcell a 200ms / tracklength
         int clock = 200000000 /(25* tracklength);


         // Set the offset
         int offset_track = 0;

         // Add to header buffer
         AddIntToBuffer(buffer, 0x10 + track * sizeof(int), offset);

         // Compute max length of the buffer
         // Allocate max possible buffer
         pTrackBuffer/*[track]*/ = new unsigned char[tracklength * 2 + 0x40];
         // Max is transition every cells : 16 bits / transitions

         // Header
         memcpy(&pTrackBuffer/*[track]*/[offset_track], "TRK", 3);
         offset_track += 3;
         pTrackBuffer/*[track]*/[offset_track++] = track; // (track<<1)|track%2;

         // INDEX TIME = 32 BIT VALUE, TIME IN NANOSECONDS/25ns FOR ONE REVOLUTION
         unsigned int index_time = tracklength * clock;
         AddIntToBuffer(pTrackBuffer/*[track]*/, 0x04, 0x7A1200); // 200 ms for one revolution - TODO : TO ADJUST ?

         // Offset of revolution
         AddIntToBuffer(pTrackBuffer/*[track]*/, 0x0C, 0x10);

         offset_track = 0x10;
         // TRACK DATA = 16 BIT VALUE, TIME IN NANOSECONDS/25ns FOR ONE BIT CELL TIME
         int length = 0;
         //
         i = 0;

         // First bit : Depends on the last bit of the track
         // In fact, it it necessary to adjust to last '0' (or first '0' ) of the track, close to the index

         // If zero, dont begin with
         unsigned short flux = clock;
         unsigned int total_flux = clock;

         unsigned int index_on_track = 1;
         // Search for nearest '10'
         while (index_on_track < tracklength && disk->side_[side].tracks[dskTrack].bitfield[index_on_track-1] != 1 && disk->side_[side].tracks[dskTrack].bitfield[index_on_track ] != 0)
         {
            index_on_track++;
         }

         // HACK for "Reussir"
         /*
         if (track == 38)
         {
            index_on_track = 34950;
         }*/
         
         while (i < tracklength)
         {
            // Wait for next flux reversal
            // Handle weak bits (todo)

            while (i < tracklength && (disk->side_[side].tracks[dskTrack].bitfield[(i+index_on_track)%tracklength]&0x1) == 0x00)
            {
               // Overflow handling ?
               if ((int)(flux + clock) >= 0x10000)
               {
                  // Overflow handling TODO
               }

               flux += clock;
               total_flux += clock;
               ++i;
            }

            // Adjust bitcell to reach 200ms track
            double ratio = (double)i / (double)tracklength;
            double current = clock * (i+1);
            double total_aimed = 200000000.0 / (25.0 * (double)tracklength) * (double)(i+1.0);

            unsigned int adujst = (unsigned int)total_aimed - total_flux;
            total_flux += adujst; // NON
            flux += adujst; // NON

            // New one : Write it, and begin a new sequence
            AddShortToBuffer(pTrackBuffer/*[track]*/, offset_track, flux);
            //checksum += flux;

            offset_track += 2;
            length++;
            ++i;
            flux = clock;
            total_flux += clock;
         }
         // Last offset
         /*AddShortToBuffer ( pTrackBuffer[track], offsetTrack , flux );
         offsetTrack += 2;
         length++;*/

         //
         //pTrackBufferSize[track] = offsetTrack;
         // Track length
         offset += offset_track;
         AddIntToBuffer(pTrackBuffer/*[track]*/, 0x08, length); // 200 ms for one revolution - TODO : TO ADJUST ?

         for (int crc = 0; crc < offset_track; crc++)
         {
            checksum += pTrackBuffer[crc];
         }

         fwrite(pTrackBuffer, offset_track, 1, file);
         delete[]pTrackBuffer;
      }

      // Timestamp


      // --- Checksum : Compute it
      // Header
      for (i = 0x10; i < 0x2A8; i++) checksum += buffer[i];
      // Write it
      // Timestamp
      // TODO

      // Write it
      memcpy(&buffer[0x0C], (unsigned int*)&checksum, 4);
      /*buffer[0x0C] =  (checksum & 0xFF);
      buffer[0x0D] =  ((checksum>>1) & 0xFF);
      buffer[0x0E] =  ((checksum>>2) & 0xFF);
      buffer[0x0F] =  ((checksum>>3) & 0xFF);*/

      // --- Write buffers
      // Go back to begining of file
      fseek(file, 0, SEEK_SET);
      fwrite(buffer, 0x2A8, 1, file);

      /*// Track buffers
      for (int track = 0; track < m_Disk[0].NbTracks + m_Disk[1].NbTracks; track ++)
      {
      fwrite ( pTrackBuffer[track],  pTrackBufferSize[track], 1, file) ;
      }

      */

      disk->disk_modified_ = false;
      fclose(file);
   }

   //delete []pTrackBufferSize;

   /*for (unsigned char track = 0; track < m_Disk[0].NbTracks + m_Disk[1].NbTracks; track ++)
   delete (pTrackBuffer[track]);
   delete []pTrackBuffer;*/

   return 0;
}